

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O1

int Bmc_CexBitCount(Abc_Cex_t *p,int nInputs)

{
  uint uVar1;
  int iVar2;
  
  if (p == (Abc_Cex_t *)0x0) {
    puts("The counter example is NULL.");
    iVar2 = -1;
  }
  else if (p->nBits < 1) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    uVar1 = 0;
    do {
      iVar2 = iVar2 + ((uint)((int)(uVar1 - p->nRegs) % p->nPis < nInputs) &
                      (uint)(&p[1].iPo)[uVar1 >> 5] >> ((byte)uVar1 & 0x1f));
      uVar1 = uVar1 + 1;
    } while (p->nBits != uVar1);
  }
  return iVar2;
}

Assistant:

int Bmc_CexBitCount( Abc_Cex_t * p, int nInputs )
{
    int k, Counter = 0, Counter2 = 0;
    if ( p == NULL )
    {
        printf( "The counter example is NULL.\n" );
        return -1;
    }
    for ( k = 0; k < p->nBits; k++ )
    {
        Counter += Abc_InfoHasBit(p->pData, k);
        if ( (k - p->nRegs) % p->nPis < nInputs )
            Counter2 += Abc_InfoHasBit(p->pData, k);
    }
    return Counter2;
}